

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  int iVar1;
  long lVar2;
  vec<4UL,_double> *pvVar3;
  vec<4UL,_double> *pvVar4;
  long lVar5;
  size_t y;
  size_t x;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vec2f A;
  vec2f B;
  vec2f C;
  vec2f P;
  array<vec<2UL,_double>,_3UL> pts2;
  vec3f bc_screen;
  TGAColor local_158;
  int local_150;
  int local_14c;
  double local_148;
  double local_140;
  double local_138;
  double local_130 [3];
  size_t local_118;
  ulong local_110;
  TGAImage *local_108;
  Model *local_100;
  IShader *local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98 [7];
  double local_60;
  double dStack_58;
  double local_50;
  vec3f local_48;
  
  pvVar4 = pts._M_elems;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar2 = 0;
  pvVar3 = pvVar4;
  do {
    uVar7 = 0;
    uVar8 = 0;
    lVar5 = 8;
    dVar13 = 0.0;
    do {
      dVar9 = *(double *)((long)((vec<4UL,_double> *)pvVar3->data)->data + lVar5);
      if (lVar5 != 0) {
        uVar7 = SUB84(dVar9,0);
        uVar8 = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar13;
      }
      lVar5 = lVar5 + -8;
      dVar13 = dVar9;
    } while (lVar5 != -8);
    local_98[lVar2 * 2] = dVar9;
    local_98[lVar2 * 2 + 1] = (double)CONCAT44(uVar8,uVar7);
    lVar2 = lVar2 + 1;
    pvVar3 = pvVar3 + 1;
  } while (lVar2 != 3);
  uVar7 = 0xffffffff;
  uVar8 = 0xffefffff;
  dVar12 = 1.79769313486232e+308;
  lVar2 = 0;
  dVar9 = 1.79769313486232e+308;
  dVar13 = -1.79769313486232e+308;
  do {
    lVar5 = 0;
    dVar10 = dVar9;
    dVar11 = dVar13;
    do {
      bVar6 = lVar5 == 0;
      dVar9 = dVar12;
      if (!bVar6) {
        dVar9 = dVar10;
      }
      dVar13 = pvVar4->data[lVar5] / pts._M_elems[lVar2].data[3];
      dVar15 = dVar13;
      if (dVar9 <= dVar13) {
        dVar15 = dVar9;
      }
      dVar9 = dVar15;
      dVar14 = dVar11;
      if (bVar6) {
        dVar9 = dVar10;
        dVar12 = dVar15;
        dVar14 = (double)CONCAT44(uVar8,uVar7);
      }
      if (dVar13 <= dVar14) {
        dVar13 = dVar14;
      }
      if (bVar6) {
        uVar7 = SUB84(dVar13,0);
        uVar8 = (undefined4)((ulong)dVar13 >> 0x20);
        dVar13 = dVar11;
      }
      lVar5 = lVar5 + 1;
      dVar10 = dVar9;
      dVar11 = dVar13;
    } while (lVar5 == 1);
    lVar2 = lVar2 + 1;
    pvVar4 = pvVar4 + 1;
  } while (lVar2 != 3);
  local_158.bytespp = '\0';
  local_158.bgra[0] = '\0';
  local_158.bgra[1] = '\0';
  local_158.bgra[2] = '\0';
  local_158.bgra[3] = '\0';
  if ((int)dVar12 <= (int)(double)CONCAT44(uVar8,uVar7)) {
    local_14c = (int)dVar9;
    local_110 = (ulong)(uint)(int)dVar13;
    local_a8 = local_98[0];
    local_b0 = local_98[1];
    local_b8 = local_98[2];
    local_c0 = local_98[3];
    local_c8 = local_98[4];
    local_d0 = local_98[5];
    local_d8 = pts._M_elems[0].data[2];
    local_138 = pts._M_elems[0].data[3];
    local_140 = pts._M_elems[1].data[3];
    local_148 = pts._M_elems[2].data[3];
    local_e0 = pts._M_elems[1].data[2];
    local_e8 = pts._M_elems[2].data[2];
    local_118 = (size_t)local_14c;
    x = (size_t)(int)dVar12;
    local_150 = (int)(double)CONCAT44(uVar8,uVar7) + 1;
    local_108 = image;
    local_100 = model;
    local_f8 = shader;
    do {
      if (local_14c <= (int)local_110) {
        local_a0 = (double)(int)x;
        y = local_118;
        do {
          P.y = (double)(int)y;
          A.y = local_b0;
          A.x = local_a8;
          B.y = local_c0;
          B.x = local_b8;
          C.y = local_d0;
          C.x = local_c8;
          P.x = local_a0;
          barycentric(&local_48,A,B,C,P);
          local_130[0] = local_48.x / local_138;
          local_130[1] = local_48.y / local_140;
          local_130[2] = local_48.z / local_148;
          lVar2 = -1;
          do {
            lVar5 = (ulong)(lVar2 != 0) * 8 + 8;
            if (lVar2 == 1) {
              lVar5 = 0;
            }
            *(double *)((long)local_130 + lVar5) =
                 *(double *)((long)local_130 + lVar5) /
                 (local_48.x / local_138 + local_48.y / local_140 + local_48.z / local_148);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 2);
          dVar9 = (local_e8 * local_48.z + local_d8 * local_48.x + local_48.y * local_e0) /
                  (local_148 * local_48.z + local_138 * local_48.x + local_48.y * local_140) + 0.5;
          if (255.0 <= dVar9) {
            dVar9 = 255.0;
          }
          if (((0.0 <= local_48.x) && (0.0 <= local_48.y)) && (0.0 <= local_48.z)) {
            if (dVar9 <= 0.0) {
              dVar9 = 0.0;
            }
            if ((zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[zbuffer->width * x + y] <= dVar9) {
              local_60 = local_130[0];
              dStack_58 = local_130[1];
              local_50 = local_130[2];
              local_f0 = dVar9;
              iVar1 = (*local_f8->_vptr_IShader[3])(local_f8,local_100,&local_158);
              if ((char)iVar1 == '\0') {
                (zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[zbuffer->width * x + y] = local_f0;
                TGAImage::set(local_108,x,y,&local_158);
              }
            }
          }
          y = y + 1;
        } while ((int)dVar13 + 1U != (int)y);
      }
      x = x + 1;
    } while (local_150 != (int)x);
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    std::array<vec2f, 3> pts2;
    for (int i = 0; i < 3; i++) pts2[i] = proj<2>(pts[i]);

    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f bc_screen = barycentric(pts2[0], pts2[1], pts2[2], to_f(P));
            vec3f bc_clip =
                vec3f(bc_screen.x / pts[0][3], bc_screen.y / pts[1][3], bc_screen.z / pts[2][3]);
            bc_clip = bc_clip / (bc_clip.x + bc_clip.y + bc_clip.z);
            double z = pts[0][2] * bc_screen.x + pts[1][2] * bc_screen.y + pts[2][2] * bc_screen.z;
            double w = pts[0][3] * bc_screen.x + pts[1][3] * bc_screen.y + pts[2][3] * bc_screen.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0 ||
                zbuffer.get(P.x, P.y) > frag_depth)
                continue;
            bool discard = shader.fragment(model, bc_clip, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}